

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

bool __thiscall
DependencyScan::RecomputeOutputDirty
          (DependencyScan *this,Edge *edge,Node *most_recent_input,string *command,Node *output)

{
  bool bVar1;
  LogEntry *pLVar2;
  long lVar3;
  uint64_t uVar4;
  pointer pcVar5;
  char *pcVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar7;
  char *__format;
  pointer pcVar8;
  TimeStamp TVar9;
  StringPiece command_00;
  string local_58;
  long local_38;
  
  if (edge->rule_ == &State::kPhonyRule) {
    if (((edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_start ==
         (edge->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish) && (output->exists_ != ExistenceStatusExists)) {
      if (g_explaining) {
        RecomputeOutputDirty((DependencyScan *)output);
        return true;
      }
      return true;
    }
    if (most_recent_input == (Node *)0x0) {
      return false;
    }
    if (output->exists_ == ExistenceStatusExists) {
      return false;
    }
    lVar3 = most_recent_input->mtime_;
    if (most_recent_input->mtime_ < output->mtime_) {
      lVar3 = output->mtime_;
    }
    output->mtime_ = lVar3;
    return false;
  }
  if (output->exists_ != ExistenceStatusExists) {
    if (g_explaining) {
      RecomputeOutputDirty((DependencyScan *)output);
      return true;
    }
    return true;
  }
  if ((most_recent_input == (Node *)0x0) || (most_recent_input->mtime_ <= output->mtime_)) {
    pLVar2 = (LogEntry *)0x0;
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_38 = output->mtime_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"restat","");
    bVar1 = Edge::GetBindingBool(edge,&local_58);
    if ((bVar1) && (this->build_log_ != (BuildLog *)0x0)) {
      pLVar2 = BuildLog::LookupByOutput(this->build_log_,&output->path_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (pLVar2 == (LogEntry *)0x0) goto LAB_00114e73;
      pcVar6 = "restat of ";
      TVar9 = pLVar2->mtime;
    }
    else {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
LAB_00114e73:
      pLVar2 = (LogEntry *)0x0;
      pcVar6 = "";
      TVar9 = local_38;
    }
    if (TVar9 < most_recent_input->mtime_) {
      if (g_explaining != true) {
        return true;
      }
      pcVar5 = (output->path_)._M_dataplus._M_p;
      pcVar8 = (most_recent_input->path_)._M_dataplus._M_p;
      __format = "ninja explain: %soutput %s older than most recent input %s (%ld vs %ld)\n";
      goto LAB_00114eaf;
    }
  }
  if (this->build_log_ != (BuildLog *)0x0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"generator","");
    bVar1 = Edge::GetBindingBool(edge,&local_58);
    sVar7 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      sVar7 = extraout_RDX_00;
    }
    if ((pLVar2 == (LogEntry *)0x0) &&
       (pLVar2 = BuildLog::LookupByOutput(this->build_log_,&output->path_), sVar7 = extraout_RDX_01,
       pLVar2 == (LogEntry *)0x0)) {
      if (!bVar1) {
        if (g_explaining == true) {
          RecomputeOutputDirty((DependencyScan *)output);
          return true;
        }
        return true;
      }
    }
    else {
      if ((!bVar1) &&
         (command_00.len_ = sVar7, command_00.str_ = (char *)command->_M_string_length,
         uVar4 = BuildLog::LogEntry::HashCommand((LogEntry *)(command->_M_dataplus)._M_p,command_00)
         , uVar4 != pLVar2->command_hash)) {
        if (g_explaining == true) {
          RecomputeOutputDirty((DependencyScan *)output);
          return true;
        }
        return true;
      }
      if ((most_recent_input != (Node *)0x0) &&
         (pcVar8 = (pointer)pLVar2->mtime, (long)pcVar8 < most_recent_input->mtime_)) {
        if (g_explaining != true) {
          return true;
        }
        pcVar6 = (output->path_)._M_dataplus._M_p;
        pcVar5 = (most_recent_input->path_)._M_dataplus._M_p;
        __format = 
        "ninja explain: recorded mtime of %s older than most recent input %s (%ld vs %ld)\n";
LAB_00114eaf:
        fprintf(_stderr,__format,pcVar6,pcVar5,pcVar8);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DependencyScan::RecomputeOutputDirty(const Edge* edge,
                                          const Node* most_recent_input,
                                          const string& command,
                                          Node* output) {
  if (edge->is_phony()) {
    // Phony edges don't write any output.  Outputs are only dirty if
    // there are no inputs and we're missing the output.
    if (edge->inputs_.empty() && !output->exists()) {
      EXPLAIN("output %s of phony edge with no inputs doesn't exist",
              output->path().c_str());
      return true;
    }

    // Update the mtime with the newest input. Dependents can thus call mtime()
    // on the fake node and get the latest mtime of the dependencies
    if (most_recent_input) {
      output->UpdatePhonyMtime(most_recent_input->mtime());
    }

    // Phony edges are clean, nothing to do
    return false;
  }

  BuildLog::LogEntry* entry = 0;

  // Dirty if we're missing the output.
  if (!output->exists()) {
    EXPLAIN("output %s doesn't exist", output->path().c_str());
    return true;
  }

  // Dirty if the output is older than the input.
  if (most_recent_input && output->mtime() < most_recent_input->mtime()) {
    TimeStamp output_mtime = output->mtime();

    // If this is a restat rule, we may have cleaned the output with a restat
    // rule in a previous run and stored the most recent input mtime in the
    // build log.  Use that mtime instead, so that the file will only be
    // considered dirty if an input was modified since the previous run.
    bool used_restat = false;
    if (edge->GetBindingBool("restat") && build_log() &&
        (entry = build_log()->LookupByOutput(output->path()))) {
      output_mtime = entry->mtime;
      used_restat = true;
    }

    if (output_mtime < most_recent_input->mtime()) {
      EXPLAIN("%soutput %s older than most recent input %s "
              "(%" PRId64 " vs %" PRId64 ")",
              used_restat ? "restat of " : "", output->path().c_str(),
              most_recent_input->path().c_str(),
              output_mtime, most_recent_input->mtime());
      return true;
    }
  }

  if (build_log()) {
    bool generator = edge->GetBindingBool("generator");
    if (entry || (entry = build_log()->LookupByOutput(output->path()))) {
      if (!generator &&
          BuildLog::LogEntry::HashCommand(command) != entry->command_hash) {
        // May also be dirty due to the command changing since the last build.
        // But if this is a generator rule, the command changing does not make us
        // dirty.
        EXPLAIN("command line changed for %s", output->path().c_str());
        return true;
      }
      if (most_recent_input && entry->mtime < most_recent_input->mtime()) {
        // May also be dirty due to the mtime in the log being older than the
        // mtime of the most recent input.  This can occur even when the mtime
        // on disk is newer if a previous run wrote to the output file but
        // exited with an error or was interrupted.
        EXPLAIN("recorded mtime of %s older than most recent input %s (%" PRId64 " vs %" PRId64 ")",
                output->path().c_str(), most_recent_input->path().c_str(),
                entry->mtime, most_recent_input->mtime());
        return true;
      }
    }
    if (!entry && !generator) {
      EXPLAIN("command line not found in log for %s", output->path().c_str());
      return true;
    }
  }

  return false;
}